

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  bool *location_00;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  option_group_definition *poVar6;
  options_boost_po *this;
  vw_exception *this_00;
  vw_ostream *pvVar7;
  byte bVar8;
  ulong uVar9;
  option_group_definition input_options;
  string data;
  undefined1 *local_16f0 [2];
  undefined1 local_16e0 [16];
  undefined1 *local_16d0 [2];
  undefined1 local_16c0 [16];
  string local_16b0;
  undefined1 *local_1690 [2];
  undefined1 local_1680 [16];
  string local_1670;
  undefined1 *local_1650 [2];
  undefined1 local_1640 [16];
  string local_1630;
  undefined1 *local_1610 [2];
  undefined1 local_1600 [16];
  string local_15f0;
  undefined1 *local_15d0 [2];
  undefined1 local_15c0 [16];
  undefined1 *local_15b0 [2];
  undefined1 local_15a0 [16];
  string local_1590;
  undefined1 *local_1570 [2];
  undefined1 local_1560 [16];
  string local_1550;
  undefined1 *local_1530 [2];
  undefined1 local_1520 [16];
  string local_1510;
  undefined1 *local_14f0 [2];
  undefined1 local_14e0 [16];
  string local_14d0;
  undefined1 *local_14b0 [2];
  undefined1 local_14a0 [16];
  string local_1490;
  undefined1 *local_1470 [2];
  undefined1 local_1460 [16];
  string local_1450;
  undefined1 *local_1430 [2];
  undefined1 local_1420 [16];
  string local_1410;
  undefined1 *local_13f0 [2];
  undefined1 local_13e0 [16];
  undefined1 *local_13d0 [2];
  undefined1 local_13c0 [16];
  string local_13b0;
  undefined1 *local_1390;
  long local_1388;
  undefined1 local_1380 [16];
  option_group_definition local_1370;
  undefined1 *local_1338 [2];
  undefined1 local_1328 [16];
  string local_1318;
  undefined1 *local_12f8 [2];
  undefined1 local_12e8 [16];
  string local_12d8;
  undefined1 local_12b8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1220;
  undefined1 local_1218 [16];
  undefined1 local_1208 [64];
  string local_11c8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1180;
  string local_1090;
  undefined1 local_1070 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fe8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd8;
  undefined1 local_fd0 [80];
  string local_f80 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f38;
  undefined1 local_f30 [80];
  string local_ee0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e98;
  undefined1 local_e90 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_df8;
  undefined1 local_df0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d58;
  undefined1 local_d50 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb8;
  undefined1 local_cb0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c18;
  undefined1 local_c10 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b78;
  undefined1 local_b70 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ae8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad8;
  undefined1 local_ad0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a38;
  undefined1 local_a30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  typed_option<bool> local_8f0;
  typed_option<bool> local_850;
  typed_option<bool> local_7b0;
  typed_option<bool> local_710;
  typed_option<bool> local_670;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  typed_option<bool> local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1390 = local_1380;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1390,"Input options","");
  local_1370.m_name._M_dataplus._M_p = (pointer)&local_1370.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1370,local_1390,local_1390 + local_1388);
  local_1370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1370.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1390 != local_1380) {
    operator_delete(local_1390);
  }
  local_13b0._M_dataplus._M_p = (pointer)&local_13b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b0,"data","");
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1218,&local_13b0,location);
  local_13d0[0] = local_13c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13d0,"d","");
  std::__cxx11::string::_M_assign(local_11c8);
  local_13f0[0] = local_13e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13f0,"Example set","");
  std::__cxx11::string::_M_assign((string *)(local_1208 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1218);
  poVar6 = VW::config::option_group_definition::add<std::__cxx11::string>(&local_1370,&local_d0);
  local_1410._M_dataplus._M_p = (pointer)&local_1410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"daemon","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_12b8,&local_1410,&__return_storage_ptr__->daemon);
  local_1430[0] = local_1420;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1430,"persistent daemon mode on port 26542","");
  std::__cxx11::string::_M_assign((string *)(local_12b8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_12b8);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_170);
  local_1450._M_dataplus._M_p = (pointer)&local_1450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1450,"foreground","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1070,&local_1450,&__return_storage_ptr__->foreground);
  local_1470[0] = local_1460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1470,"in persistent daemon mode, do not run in the background","");
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_1070);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_210);
  local_1490._M_dataplus._M_p = (pointer)&local_1490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1490,"port","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_990,&local_1490,&__return_storage_ptr__->port);
  local_14b0[0] = local_14a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14b0,"port to listen on; use 0 to pick unused port","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_990);
  poVar6 = VW::config::option_group_definition::add<unsigned_long>(poVar6,&local_2b0);
  local_14d0._M_dataplus._M_p = (pointer)&local_14d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14d0,"num_children","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_a30,&local_14d0,&all->num_children);
  local_14f0[0] = local_14e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14f0,"number of children for persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_350,(typed_option<unsigned_long> *)local_a30);
  poVar6 = VW::config::option_group_definition::add<unsigned_long>(poVar6,&local_350);
  local_1510._M_dataplus._M_p = (pointer)&local_1510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1510,"pid_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ad0,&local_1510,&__return_storage_ptr__->pid_file);
  local_1530[0] = local_1520;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1530,"Write pid file in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_ad0 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_ad0);
  poVar6 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar6,&local_3f0);
  local_1550._M_dataplus._M_p = (pointer)&local_1550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1550,"port_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b70,&local_1550,&__return_storage_ptr__->port_file);
  local_1570[0] = local_1560;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1570,"Write port used in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_b70 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b70);
  poVar6 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar6,&local_490);
  local_1590._M_dataplus._M_p = (pointer)&local_1590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1590,"cache","");
  location_00 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f30,&local_1590,location_00);
  local_15b0[0] = local_15a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15b0,"c","");
  std::__cxx11::string::_M_assign(local_ee0);
  local_15d0[0] = local_15c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15d0,"Use a cache.  The default is <data>.cache","");
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_f30);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_530);
  local_15f0._M_dataplus._M_p = (pointer)&local_15f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_15f0,"cache_file","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c10,&local_15f0,&__return_storage_ptr__->cache_files);
  local_1610[0] = local_1600;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1610,"The location(s) of cache_file.","");
  std::__cxx11::string::_M_assign((string *)(local_c10 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_5d0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c10);
  poVar6 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar6,&local_5d0);
  local_1630._M_dataplus._M_p = (pointer)&local_1630.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1630,"json","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_cb0,&local_1630,&__return_storage_ptr__->json);
  local_1650[0] = local_1640;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1650,"Enable JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_cb0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_cb0);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_670);
  local_1670._M_dataplus._M_p = (pointer)&local_1670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1670,"dsjson","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d50,&local_1670,&__return_storage_ptr__->dsjson);
  local_1690[0] = local_1680;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1690,"Enable Decision Service JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_d50 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_710,(typed_option<bool> *)local_d50);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_710);
  local_16b0._M_dataplus._M_p = (pointer)&local_16b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16b0,"kill_cache","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_fd0,&local_16b0,&__return_storage_ptr__->kill_cache);
  local_16d0[0] = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16d0,"k","");
  std::__cxx11::string::_M_assign(local_f80);
  local_16f0[0] = local_16e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16f0,"do not reuse existing cache: create a new one always","");
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_fd0);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_7b0);
  local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"compressed","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_df0,&local_12d8,&__return_storage_ptr__->compressed);
  local_12f8[0] = local_12e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12f8,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_df0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_850,(typed_option<bool> *)local_df0);
  poVar6 = VW::config::option_group_definition::add<bool>(poVar6,&local_850);
  local_1318._M_dataplus._M_p = (pointer)&local_1318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1318,"no_stdin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_e90,&local_1318,&all->stdin_off);
  local_1338[0] = local_1328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1338,"do not default to reading from stdin","");
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_8f0,(typed_option<bool> *)local_e90);
  VW::config::option_group_definition::add<bool>(poVar6,&local_8f0);
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_8f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_1338[0] != local_1328) {
    operator_delete(local_1338[0]);
  }
  local_e90._0_8_ = &PTR__typed_option_002d4128;
  if (local_df8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_df8._M_pi);
  }
  if (local_e08._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e08._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_e90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1318._M_dataplus._M_p != &local_1318.field_2) {
    operator_delete(local_1318._M_dataplus._M_p);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_12f8[0] != local_12e8) {
    operator_delete(local_12f8[0]);
  }
  local_df0._0_8_ = &PTR__typed_option_002d4128;
  if (local_d58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d58._M_pi);
  }
  if (local_d68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d68._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
    operator_delete(local_12d8._M_dataplus._M_p);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_16f0[0] != local_16e0) {
    operator_delete(local_16f0[0]);
  }
  if (local_16d0[0] != local_16c0) {
    operator_delete(local_16d0[0]);
  }
  local_fd0._0_8_ = &PTR__typed_option_002d4128;
  if (local_f38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f38._M_pi);
  }
  if (local_f48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16b0._M_dataplus._M_p != &local_16b0.field_2) {
    operator_delete(local_16b0._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_1690[0] != local_1680) {
    operator_delete(local_1690[0]);
  }
  local_d50._0_8_ = &PTR__typed_option_002d4128;
  if (local_cb8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cb8._M_pi);
  }
  if (local_cc8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cc8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1670._M_dataplus._M_p != &local_1670.field_2) {
    operator_delete(local_1670._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1650[0] != local_1640) {
    operator_delete(local_1650[0]);
  }
  local_cb0._0_8_ = &PTR__typed_option_002d4128;
  if (local_c18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c18._M_pi);
  }
  if (local_c28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c28._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_cb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1630._M_dataplus._M_p != &local_1630.field_2) {
    operator_delete(local_1630._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4200;
  if (local_5d0.m_default_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_1610[0] != local_1600) {
    operator_delete(local_1610[0]);
  }
  local_c10._0_8_ = &PTR__typed_option_002d4200;
  if (local_b78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b78._M_pi);
  }
  if (local_b88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b88._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15f0._M_dataplus._M_p != &local_15f0.field_2) {
    operator_delete(local_15f0._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_15d0[0] != local_15c0) {
    operator_delete(local_15d0[0]);
  }
  if (local_15b0[0] != local_15a0) {
    operator_delete(local_15b0[0]);
  }
  local_f30._0_8_ = &PTR__typed_option_002d4128;
  if (local_e98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e98._M_pi);
  }
  if (local_ea8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ea8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1590._M_dataplus._M_p != &local_1590.field_2) {
    operator_delete(local_1590._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_490.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1570[0] != local_1560) {
    operator_delete(local_1570[0]);
  }
  local_b70._0_8_ = &PTR__typed_option_002d4190;
  if (local_ad8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ad8._M_pi);
  }
  if (local_ae8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ae8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_3f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_1530[0] != local_1520) {
    operator_delete(local_1530[0]);
  }
  local_ad0._0_8_ = &PTR__typed_option_002d4190;
  if (local_a38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a38._M_pi);
  }
  if (local_a48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1510._M_dataplus._M_p != &local_1510.field_2) {
    operator_delete(local_1510._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d41c8;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_14f0[0] != local_14e0) {
    operator_delete(local_14f0[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002d41c8;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14d0._M_dataplus._M_p != &local_14d0.field_2) {
    operator_delete(local_14d0._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d41c8;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_14b0[0] != local_14a0) {
    operator_delete(local_14b0[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002d41c8;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1490._M_dataplus._M_p != &local_1490.field_2) {
    operator_delete(local_1490._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_1470[0] != local_1460) {
    operator_delete(local_1470[0]);
  }
  local_1070._0_8_ = &PTR__typed_option_002d4128;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd8._M_pi);
  }
  if (local_fe8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fe8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1070);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1450._M_dataplus._M_p != &local_1450.field_2) {
    operator_delete(local_1450._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4128;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_1430[0] != local_1420) {
    operator_delete(local_1430[0]);
  }
  local_12b8._0_8_ = &PTR__typed_option_002d4128;
  if (local_1220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1220._M_pi);
  }
  if (local_1230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1230._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1410._M_dataplus._M_p != &local_1410.field_2) {
    operator_delete(local_1410._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d4190;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_13f0[0] != local_13e0) {
    operator_delete(local_13f0[0]);
  }
  if (local_13d0[0] != local_13c0) {
    operator_delete(local_13d0[0]);
  }
  local_1218._0_8_ = &PTR__typed_option_002d4190;
  if (local_1180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1180._M_pi);
  }
  if (local_1190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1190._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13b0._M_dataplus._M_p != &local_13b0.field_2) {
    operator_delete(local_13b0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1370);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo,0);
  if (this != (options_boost_po *)0x0) {
    local_1218._8_8_ = (string *)0x0;
    local_1208[0] = '\0';
    local_12b8._0_8_ = local_12b8 + 0x10;
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"data","");
    bVar3 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_12b8,(string *)local_1218,-1);
    if ((undefined1 *)local_12b8._0_8_ != local_12b8 + 0x10) {
      operator_delete((void *)local_12b8._0_8_);
    }
    if ((bVar3) &&
       ((psVar1 = (string *)(all->data_filename)._M_string_length,
        psVar1 != (string *)local_1218._8_8_ ||
        ((psVar1 != (string *)0x0 &&
         (iVar5 = bcmp((location->_M_dataplus)._M_p,(void *)local_1218._0_8_,(size_t)psVar1),
         iVar5 != 0)))))) {
      std::__cxx11::string::_M_assign((string *)location);
    }
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
  }
  if (__return_storage_ptr__->daemon == false) {
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,"pid_file","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_1218);
    bVar8 = 1;
    if ((char)iVar5 == '\0') {
      local_12b8._0_8_ = local_12b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"port","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_12b8);
      bVar3 = all->active;
      if ((undefined1 *)local_12b8._0_8_ != local_12b8 + 0x10) {
        operator_delete((void *)local_12b8._0_8_);
      }
      bVar8 = (byte)iVar5 & (bVar3 ^ 1U);
    }
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
    if (bVar8 != 0) goto LAB_00125860;
  }
  else {
LAB_00125860:
    all->daemon = true;
    all->numpasses = 100000;
  }
  if (*location_00 == true) {
    pcVar2 = (all->data_filename)._M_dataplus._M_p;
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1218,pcVar2,pcVar2 + (all->data_filename)._M_string_length);
    std::__cxx11::string::append(local_1218);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->cache_files,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1218);
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
  }
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  local_1218._0_8_ = local_1208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,".gz","");
  psVar1 = (string *)(all->data_filename)._M_string_length;
  uVar9 = (long)psVar1 - local_1218._8_8_;
  if (psVar1 < (ulong)local_1218._8_8_ || uVar9 == 0) {
    bVar3 = false;
  }
  else {
    iVar5 = std::__cxx11::string::compare((ulong)location,uVar9,(string *)local_1218._8_8_);
    bVar3 = iVar5 == 0;
  }
  if ((undefined1 *)local_1218._0_8_ != local_1208) {
    operator_delete((void *)local_1218._0_8_);
  }
  if (bVar3) {
    set_compressed(all->p);
  }
  bVar3 = *location_00;
  if (bVar3 == false) {
    local_12b8._0_8_ = local_12b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"cache_file","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_12b8);
    if ((char)iVar5 != '\0') goto LAB_001259a7;
    cVar4 = '\0';
  }
  else {
LAB_001259a7:
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,"invert_hash","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_1218);
    cVar4 = (char)iVar5;
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
    if (bVar3 != false) goto LAB_00125a09;
  }
  if ((undefined1 *)local_12b8._0_8_ != local_12b8 + 0x10) {
    operator_delete((void *)local_12b8._0_8_);
  }
LAB_00125a09:
  if (cVar4 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1208,
               "invert_hash is incompatible with a cache file.  Use it in single pass mode only.",
               0x50);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
               ,0x1d5,&local_1090);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (all->holdout_set_off == false) {
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1218,"output_feature_regularizer_binary","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_1218);
    cVar4 = '\x01';
    if ((char)iVar5 == '\0') {
      local_1070._0_8_ = local_1070 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1070,"output_feature_regularizer_text","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_1070);
      cVar4 = (char)iVar5;
      if ((undefined1 *)local_1070._0_8_ != local_1070 + 0x10) {
        operator_delete((void *)local_1070._0_8_);
      }
    }
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
    if (cVar4 != '\0') {
      all->holdout_set_off = true;
      pvVar7 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar7->super_ostream,
                 "Making holdout_set_off=true since output regularizer specified",0x3e);
      std::ios::widen((char)(pvVar7->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar7);
      std::ostream::put((char)pvVar7);
      std::ostream::flush();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1370.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1370.m_name._M_dataplus._M_p != &local_1370.m_name.field_2) {
    operator_delete(local_1370.m_name._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}